

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderTests<flatbuffers::FlatBufferBuilderImpl<false>,_flatbuffers::FlatBufferBuilderImpl<false>_>
     ::nonempty_builder_movector_test(void)

{
  ulong expval;
  FlatBufferBuilderImpl<false> src;
  FlatBufferBuilderImpl<false> dst;
  
  src.buf_.allocator_ = (Allocator *)0x0;
  src.buf_.own_allocator_ = false;
  src.buf_.initial_size_ = 0x400;
  src.buf_.max_size_ = 0x7fffffff;
  src.buf_.buffer_minalign_ = 8;
  src.buf_.reserved_ = 0;
  src.buf_.size_ = 0;
  src.length_of_64_bit_region_ = 0;
  src.nested = false;
  src.finished = false;
  src.buf_.buf_ = (uint8_t *)0x0;
  src.buf_.cur_._0_6_ = 0;
  src.buf_.cur_._6_2_ = 0;
  src.buf_.scratch_._0_6_ = 0;
  src._78_8_ = 0;
  src.minalign_ = 1;
  src.force_defaults_ = false;
  src.dedup_vtables_ = true;
  src.string_pool = (StringOffsetMap *)0x0;
  populate1(&src);
  expval = (ulong)src.buf_.size_;
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl(&dst,&src);
  TestEq<unsigned_long,unsigned_int>
            (expval,dst.buf_.size_,"\'src_size\' != \'dst.GetSize()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
             ,0x60,
             "static void BuilderTests<flatbuffers::FlatBufferBuilderImpl<>>::nonempty_builder_movector_test() [DestBuilder = flatbuffers::FlatBufferBuilderImpl<>, SrcBuilder = flatbuffers::FlatBufferBuilderImpl<>]"
            );
  TestEq<unsigned_int,int>
            (src.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
             ,0x61,
             "static void BuilderTests<flatbuffers::FlatBufferBuilderImpl<>>::nonempty_builder_movector_test() [DestBuilder = flatbuffers::FlatBufferBuilderImpl<>, SrcBuilder = flatbuffers::FlatBufferBuilderImpl<>]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&dst);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&src);
  return;
}

Assistant:

static void nonempty_builder_movector_test() {
    SrcBuilder src;
    populate1(src);
    size_t src_size = src.GetSize();
    DestBuilder dst(std::move(src));
    TEST_EQ_FUNC(src_size, dst.GetSize());
    TEST_EQ_FUNC(src.GetSize(), 0);
  }